

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<char_*>::Matcher(Matcher<char_*> *this,char *value)

{
  Matcher<char_*> *in_RDI;
  Matcher<char_*> *in_stack_ffffffffffffffa8;
  EqMatcher<char_*> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<char_*>::MatcherBase((MatcherBase<char_*> *)0x18d28d);
  (in_RDI->super_MatcherBase<char_*>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_003d6550;
  Eq<char*>((char *)in_stack_ffffffffffffffa8);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=(in_RDI,in_stack_ffffffffffffffa8);
  ~Matcher((Matcher<char_*> *)0x18d2e3);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }